

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.h
# Opt level: O2

TemplateString * __thiscall
ctemplate::TemplateDictionary::Memdup
          (TemplateString *__return_storage_ptr__,TemplateDictionary *this,TemplateString *s)

{
  char *pcVar1;
  size_t sVar2;
  TemplateId TVar3;
  undefined7 uVar4;
  
  if ((s->is_immutable_ == true) && (s->ptr_[s->length_] == '\0')) {
    pcVar1 = s->ptr_;
    sVar2 = s->length_;
    uVar4 = *(undefined7 *)&s->field_0x11;
    TVar3 = s->id_;
    __return_storage_ptr__->is_immutable_ = s->is_immutable_;
    *(undefined7 *)&__return_storage_ptr__->field_0x11 = uVar4;
    __return_storage_ptr__->id_ = TVar3;
    __return_storage_ptr__->ptr_ = pcVar1;
    __return_storage_ptr__->length_ = sVar2;
  }
  else {
    Memdup(__return_storage_ptr__,this,s->ptr_,s->length_);
  }
  return __return_storage_ptr__;
}

Assistant:

TemplateString Memdup(const TemplateString& s) {
    if (s.is_immutable() && s.data()[s.size()] == '\0') {
      return s;
    }
    return Memdup(s.data(), s.size());
  }